

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

Direction __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::HandleEquality
          (LoopPeelingInfo *this,SExpression lhs,SExpression rhs)

{
  int iVar1;
  undefined4 extraout_var;
  SENode *pSVar2;
  undefined4 extraout_var_00;
  SENode *pSVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *pSVar4;
  Direction DVar5;
  ScalarEvolutionAnalysis *extraout_RDX;
  SENode *pSVar6;
  Direction DVar7;
  SExpression SVar8;
  SExpression SVar9;
  
  pSVar4 = rhs.node_;
  pSVar6 = lhs.node_;
  iVar1 = (*pSVar6->_vptr_SENode[6])(pSVar6,pSVar6,lhs.scev_,pSVar4,rhs.scev_);
  pSVar2 = pSVar6;
  if (CONCAT44(extraout_var,iVar1) != 0) {
    pSVar2 = *(SENode **)(CONCAT44(extraout_var,iVar1) + 0x38);
    pSVar2 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar2->parent_analysis_,pSVar2);
  }
  iVar1 = (*pSVar4->_vptr_SENode[6])(pSVar4);
  pSVar3 = pSVar4;
  if (CONCAT44(extraout_var_00,iVar1) != 0) {
    pSVar3 = *(SENode **)(CONCAT44(extraout_var_00,iVar1) + 0x38);
    pSVar3 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar3->parent_analysis_,pSVar3);
  }
  DVar7.first = kBefore;
  DVar7.second = 1;
  if (pSVar2 != pSVar3) {
    pSVar2 = pSVar6;
    iVar1 = (*pSVar6->_vptr_SENode[6])();
    SVar8.scev_ = extraout_RDX;
    SVar8.node_ = pSVar6;
    if ((SERecurrentNode *)CONCAT44(extraout_var_01,iVar1) != (SERecurrentNode *)0x0) {
      SVar8 = GetValueAtIteration((LoopPeelingInfo *)pSVar2,
                                  (SERecurrentNode *)CONCAT44(extraout_var_01,iVar1),
                                  this->loop_max_iterations_ - 1);
    }
    pSVar2 = pSVar4;
    iVar1 = (*pSVar4->_vptr_SENode[6])();
    if ((SERecurrentNode *)CONCAT44(extraout_var_02,iVar1) != (SERecurrentNode *)0x0) {
      SVar9 = GetValueAtIteration((LoopPeelingInfo *)pSVar2,
                                  (SERecurrentNode *)CONCAT44(extraout_var_02,iVar1),
                                  this->loop_max_iterations_ - 1);
      pSVar4 = SVar9.node_;
    }
    DVar7.first = kAfter;
    DVar7.second = 1;
    DVar5.first = kNone;
    DVar5.second = 0;
    if (SVar8.node_ != pSVar4) {
      DVar7 = DVar5;
    }
  }
  return DVar7;
}

Assistant:

LoopPeelingPass::LoopPeelingInfo::Direction
LoopPeelingPass::LoopPeelingInfo::HandleEquality(SExpression lhs,
                                                 SExpression rhs) const {
  {
    // Try peel before opportunity.
    SExpression lhs_cst = lhs;
    if (SERecurrentNode* rec_node = lhs->AsSERecurrentNode()) {
      lhs_cst = rec_node->GetOffset();
    }
    SExpression rhs_cst = rhs;
    if (SERecurrentNode* rec_node = rhs->AsSERecurrentNode()) {
      rhs_cst = rec_node->GetOffset();
    }

    if (lhs_cst == rhs_cst) {
      return Direction{LoopPeelingPass::PeelDirection::kBefore, 1};
    }
  }

  {
    // Try peel after opportunity.
    SExpression lhs_cst = lhs;
    if (SERecurrentNode* rec_node = lhs->AsSERecurrentNode()) {
      // rec_node(x) = a * x + b
      // assign to lhs: a * (loop_max_iterations_ - 1) + b
      lhs_cst = GetValueAtLastIteration(rec_node);
    }
    SExpression rhs_cst = rhs;
    if (SERecurrentNode* rec_node = rhs->AsSERecurrentNode()) {
      // rec_node(x) = a * x + b
      // assign to lhs: a * (loop_max_iterations_ - 1) + b
      rhs_cst = GetValueAtLastIteration(rec_node);
    }

    if (lhs_cst == rhs_cst) {
      return Direction{LoopPeelingPass::PeelDirection::kAfter, 1};
    }
  }

  return GetNoneDirection();
}